

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O1

Pipeline * __thiscall
n_e_s::core::Mos6502::create_zeropage_indexed_addressing_steps
          (Pipeline *__return_storage_ptr__,Mos6502 *this,uint8_t *index_reg,MemoryAccess access)

{
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  
  __return_storage_ptr__->continue_ = true;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (__return_storage_ptr__->steps_).
  super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
  ::_M_initialize_map(&(__return_storage_ptr__->steps_).
                       super__Deque_base<std::function<n_e_s::core::StepResult_()>,_std::allocator<std::function<n_e_s::core::StepResult_()>_>_>
                      ,0);
  local_48._M_unused._M_object = this;
  if (access < ReadWrite) {
    local_48._8_8_ = 0;
    pcStack_30 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1177:21)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1177:21)>
               ::_M_manager;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    pcStack_30 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1178:21)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1178:21)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    local_48._8_8_ = index_reg;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  else if (access == ReadWrite) {
    local_48._8_8_ = 0;
    pcStack_30 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1185:21)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1185:21)>
               ::_M_manager;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    pcStack_30 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1186:21)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1186:21)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    local_48._8_8_ = index_reg;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    local_48._8_8_ = 0;
    pcStack_30 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1192:21)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1192:21)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    local_48._8_8_ = 0;
    pcStack_30 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1193:21)>
                 ::_M_invoke;
    local_38 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/src/mos6502.cpp:1193:21)>
               ::_M_manager;
    local_48._M_unused._M_object = this;
    Pipeline::push(__return_storage_ptr__,(StepT *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_zeropage_indexed_addressing_steps(
        const uint8_t *index_reg,
        MemoryAccess access) {
    Pipeline result;
    if (access == MemoryAccess::Read || access == MemoryAccess::Write) {
        result.push([this] { tmp_ = mmu_->read_byte(registers_->pc++); });
        result.push([this, index_reg] {
            // Dummy read
            mmu_->read_byte(tmp_);
            const uint8_t effective_address_low = tmp_ + *index_reg;
            effective_address_ = effective_address_low;
        });
    } else if (access == MemoryAccess::ReadWrite) {
        result.push([this] { tmp_ = mmu_->read_byte(registers_->pc++); });
        result.push([this, index_reg] {
            // Dummy read
            mmu_->read_byte(tmp_);
            const uint8_t effective_address_low = tmp_ + *index_reg;
            effective_address_ = effective_address_low;
        });
        result.push([this] { tmp_ = mmu_->read_byte(effective_address_); });
        result.push([this] {
            // Extra write to effective address with old value.
            mmu_->write_byte(effective_address_, tmp_);
        });
    }
    return result;
}